

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O2

void __thiscall
kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
AdapterImpl(AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
            *this,PromiseFulfiller<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                  *fulfiller,Canceler *canceler,
           Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *inner)

{
  SourceLocation location;
  SourceLocation location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  char *local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  PromiseFulfiller<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *local_38
  ;
  anon_class_8_1_a7efefcd_for_errorHandler local_30;
  
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_00671d40;
  this->fulfiller = fulfiller;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h";
  pcStack_48 = "AdapterImpl";
  local_40 = 0x1100000393;
  location.function = "AdapterImpl";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h";
  location.lineNumber = 0x393;
  location.columnNumber = 0x11;
  local_38 = fulfiller;
  local_30.fulfiller = fulfiller;
  Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
  then<kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::AdapterImpl(kj::PromiseFulfiller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>&,kj::Canceler&,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>)::_lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)_1_,kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::PromiseFulfiller(kj::PromiseFulfiller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>&,kj::Canceler&,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>)::_lambda(kj::Exception&&)_1_>
            ((Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *)
             &local_70,(anon_class_8_1_a7efefcd_for_func *)inner,&local_30,location);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h";
  pcStack_60 = "AdapterImpl";
  local_58 = 0x1100000393;
  location_00.function = "AdapterImpl";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h";
  location_00.lineNumber = 0x393;
  location_00.columnNumber = 0x11;
  Promise<void>::eagerlyEvaluate(&this->inner,&local_70,location_00);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  return;
}

Assistant:

AdapterImpl(PromiseFulfiller<T>& fulfiller,
                Canceler& canceler, Promise<T> inner)
        : AdapterBase(canceler),
          fulfiller(fulfiller),
          inner(inner.then(
              [&fulfiller](T&& value) { fulfiller.fulfill(kj::mv(value)); },
              [&fulfiller](Exception&& e) { fulfiller.reject(kj::mv(e)); })
              .eagerlyEvaluate(nullptr)) {}